

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O2

int Cec_ManResimulateCounterExamples(Cec_ManSim_t *pSim,Vec_Int_t *vCexStore,int nFrames)

{
  Cec_ParSim_t *pCVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *p;
  Vec_Ptr_t *p_00;
  uint uVar4;
  
  p = Gia_ManCorrCreateRemapping(pSim->pAig);
  Gia_ManCreateValueRefs(pSim->pAig);
  pCVar1 = pSim->pPars;
  pCVar1->nFrames = nFrames;
  iVar2 = pSim->pAig->nRegs;
  p_00 = Vec_PtrAllocSimInfo((pSim->pAig->vCis->nSize - iVar2) * nFrames + iVar2,pCVar1->nWords);
  uVar4 = 0;
  iVar2 = 0;
  while (iVar2 < vCexStore->nSize) {
    Cec_ManStartSimInfo(p_00,pSim->pAig->nRegs);
    iVar2 = Cec_ManLoadCounterExamples(p_00,vCexStore,iVar2);
    Gia_ManCorrPerformRemapping(p,p_00);
    uVar3 = Cec_ManSeqResimulate(pSim,p_00);
    uVar4 = uVar4 | uVar3;
  }
  if (iVar2 == vCexStore->nSize) {
    Vec_PtrFree(p_00);
    Vec_IntFree(p);
    return uVar4;
  }
  __assert_fail("iStart == Vec_IntSize(vCexStore)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecCorr.c"
                ,0x236,"int Cec_ManResimulateCounterExamples(Cec_ManSim_t *, Vec_Int_t *, int)");
}

Assistant:

int Cec_ManResimulateCounterExamples( Cec_ManSim_t * pSim, Vec_Int_t * vCexStore, int nFrames )
{ 
    Vec_Int_t * vPairs;
    Vec_Ptr_t * vSimInfo; 
    int RetValue = 0, iStart = 0;
    vPairs = Gia_ManCorrCreateRemapping( pSim->pAig );
    Gia_ManCreateValueRefs( pSim->pAig );
//    pSim->pPars->nWords  = 63;
    pSim->pPars->nFrames = nFrames;
    vSimInfo = Vec_PtrAllocSimInfo( Gia_ManRegNum(pSim->pAig) + Gia_ManPiNum(pSim->pAig) * nFrames, pSim->pPars->nWords );
    while ( iStart < Vec_IntSize(vCexStore) )
    {
        Cec_ManStartSimInfo( vSimInfo, Gia_ManRegNum(pSim->pAig) );
        iStart = Cec_ManLoadCounterExamples( vSimInfo, vCexStore, iStart );
//        iStart = Cec_ManLoadCounterExamples2( vSimInfo, vCexStore, iStart );
//        Gia_ManCorrRemapSimInfo( pSim->pAig, vSimInfo );
        Gia_ManCorrPerformRemapping( vPairs, vSimInfo );
        RetValue |= Cec_ManSeqResimulate( pSim, vSimInfo );
//        Cec_ManSeqResimulateInfo( pSim->pAig, vSimInfo, NULL );
    }
//Gia_ManEquivPrintOne( pSim->pAig, 85, 0 );
    assert( iStart == Vec_IntSize(vCexStore) );
    Vec_PtrFree( vSimInfo );
    Vec_IntFree( vPairs );
    return RetValue;
}